

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O3

string * __thiscall
slang::ast::getLexicalPath_abi_cxx11_(string *__return_storage_ptr__,ast *this,Scope *scope)

{
  Symbol *this_00;
  string *extraout_RAX;
  string *psVar1;
  
  if ((this != (ast *)0x0) && (this_00 = *(Symbol **)(this + 8), this_00->kind != CompilationUnit))
  {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    Symbol::getLexicalPath(this_00,__return_storage_ptr__);
    if (((ulong)this_00->kind < 0x31) &&
       ((0x1000000300000U >> ((ulong)this_00->kind & 0x3f) & 1) != 0)) {
      psVar1 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      psVar1 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    return psVar1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return extraout_RAX;
}

Assistant:

static std::string getLexicalPath(const Scope* scope) {
    if (!scope || scope->asSymbol().kind == SymbolKind::CompilationUnit)
        return "";

    std::string str;
    auto& sym = scope->asSymbol();
    sym.getLexicalPath(str);

    if (sym.kind == SymbolKind::Package || sym.kind == SymbolKind::ClassType ||
        sym.kind == SymbolKind::CovergroupType) {
        str.append("::");
    }
    else {
        str.push_back('.');
    }

    return str;
}